

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

void __thiscall QXmlStreamWriter::QXmlStreamWriter(QXmlStreamWriter *this,QByteArray *array)

{
  _Head_base<0UL,_QXmlStreamWriterPrivate_*,_false> this_00;
  QBuffer *this_01;
  
  this_00._M_head_impl = (QXmlStreamWriterPrivate *)operator_new(0xe0);
  QXmlStreamWriterPrivate::QXmlStreamWriterPrivate(this_00._M_head_impl,this);
  (this->d_ptr)._M_t.
  super___uniq_ptr_impl<QXmlStreamWriterPrivate,_std::default_delete<QXmlStreamWriterPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QXmlStreamWriterPrivate_*,_std::default_delete<QXmlStreamWriterPrivate>_>.
  super__Head_base<0UL,_QXmlStreamWriterPrivate_*,_false>._M_head_impl = this_00._M_head_impl;
  this_01 = (QBuffer *)operator_new(0x10);
  QBuffer::QBuffer(this_01,array,(QObject *)0x0);
  (this_00._M_head_impl)->device = (QIODevice *)this_01;
  (*(this_01->super_QIODevice).super_QObject._vptr_QObject[0xd])(this_01,2);
  (this_00._M_head_impl)->field_0x78 = (this_00._M_head_impl)->field_0x78 | 1;
  return;
}

Assistant:

QXmlStreamWriter::QXmlStreamWriter(QByteArray *array)
    : d_ptr(new QXmlStreamWriterPrivate(this))
{
    Q_D(QXmlStreamWriter);
    d->device = new QBuffer(array);
    d->device->open(QIODevice::WriteOnly);
    d->deleteDevice = true;
}